

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::push_back
          (vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *this,
          endpoint_cluster_etc_params *obj)

{
  endpoint_cluster_etc_params *in_RSI;
  endpoint_cluster_etc_params *in_RDI;
  bool bVar1;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint32_t in_stack_ffffffffffffffdc;
  
  bVar1 = true;
  if ((*(endpoint_cluster_etc_params **)in_RDI->m_color_unscaled !=
       (endpoint_cluster_etc_params *)0x0) &&
     (bVar1 = true, *(endpoint_cluster_etc_params **)in_RDI->m_color_unscaled <= in_RSI)) {
    bVar1 = *(endpoint_cluster_etc_params **)in_RDI->m_color_unscaled + in_RDI->m_inten_table[0] <=
            in_RSI;
  }
  if (!bVar1) {
    __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x267,
                  "void basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::push_back(const T &) [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
                 );
  }
  if (in_RDI->m_inten_table[1] <= in_RDI->m_inten_table[0]) {
    increase_capacity((vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *)in_RDI,
                      in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                      (bool)in_stack_ffffffffffffffda);
  }
  scalar_type<basisu::basisu_frontend::endpoint_cluster_etc_params>::construct
            (in_RDI,(endpoint_cluster_etc_params *)
                    CONCAT44(in_stack_ffffffffffffffdc,
                             CONCAT13(in_stack_ffffffffffffffdb,
                                      CONCAT12(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8))
                            ));
  in_RDI->m_inten_table[0] = in_RDI->m_inten_table[0] + 1;
  return;
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }